

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  ImGuiWindow *pIVar1;
  value_type *ppIVar2;
  bool bVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiWindow *local_58;
  ImGuiWindow *window_1;
  int i_1;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImVec2 local_18;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xff1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    bVar3 = false;
    if ((GImGui->IO).ImeSetInputScreenPosFn != (_func_void_int_int *)0x0) {
      local_18 = ::operator-(&GImGui->PlatformImeLastPos,&GImGui->PlatformImePos);
      fVar4 = ImLengthSqr(&local_18);
      bVar3 = 0.0001 < fVar4;
    }
    if (bVar3) {
      (*(local_10->IO).ImeSetInputScreenPosFn)
                ((int)(local_10->PlatformImePos).x,(int)(local_10->PlatformImePos).y);
      local_10->PlatformImeLastPos = local_10->PlatformImePos;
    }
    if ((local_10->CurrentWindowStack).Size != 1) {
      __assert_fail("g.CurrentWindowStack.Size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xffd,"void ImGui::EndFrame()");
    }
    if ((local_10->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((local_10->CurrentWindow->WriteAccessed & 1U) == 0)) {
      local_10->CurrentWindow->Active = false;
    }
    End();
    if (((local_10->ActiveId == 0) && (local_10->HoveredId == 0)) &&
       ((local_10->NavWindow == (ImGuiWindow *)0x0 || ((local_10->NavWindow->Appearing & 1U) == 0)))
       ) {
      if (((local_10->IO).MouseClicked[0] & 1U) != 0) {
        if (local_10->HoveredRootWindow == (ImGuiWindow *)0x0) {
          if ((local_10->NavWindow != (ImGuiWindow *)0x0) &&
             (pIVar1 = GetFrontMostPopupModal(), pIVar1 == (ImGuiWindow *)0x0)) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
        else {
          FocusWindow(local_10->HoveredWindow);
          SetActiveID(local_10->HoveredWindow->MoveId,local_10->HoveredWindow);
          local_10->NavDisableHighlight = true;
          IVar5 = ::operator-(&(local_10->IO).MousePos,&local_10->HoveredRootWindow->Pos);
          local_10->ActiveIdClickOffset = IVar5;
          if (((local_10->HoveredWindow->Flags & 4U) == 0) &&
             ((local_10->HoveredRootWindow->Flags & 4U) == 0)) {
            local_10->MovingWindow = local_10->HoveredWindow;
          }
        }
      }
      if (((local_10->IO).MouseClicked[1] & 1U) != 0) {
        local_58 = GetFrontMostPopupModal();
        bVar3 = local_58 == (ImGuiWindow *)0x0;
        window._0_4_ = (local_10->Windows).Size;
        while (window._0_4_ = (int)window + -1, -1 < (int)window && !bVar3) {
          ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window);
          if (*ppIVar2 == local_58) break;
          if (*ppIVar2 == local_10->HoveredWindow) {
            bVar3 = true;
          }
        }
        if (bVar3) {
          local_58 = local_10->HoveredWindow;
        }
        ClosePopupsOverWindow(local_58);
      }
    }
    ImVector<ImGuiWindow_*>::resize(&local_10->WindowsSortBuffer,0);
    ImVector<ImGuiWindow_*>::reserve(&local_10->WindowsSortBuffer,(local_10->Windows).Size);
    for (window_1._4_4_ = 0; window_1._4_4_ != (local_10->Windows).Size;
        window_1._4_4_ = window_1._4_4_ + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,window_1._4_4_);
      pIVar1 = *ppIVar2;
      if (((pIVar1->Active & 1U) == 0) || ((pIVar1->Flags & 0x1000000U) == 0)) {
        AddWindowToSortedBuffer(&local_10->WindowsSortBuffer,pIVar1);
      }
    }
    if ((local_10->Windows).Size != (local_10->WindowsSortBuffer).Size) {
      __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x103d,"void ImGui::EndFrame()");
    }
    ImVector<ImGuiWindow_*>::swap(&local_10->Windows,&local_10->WindowsSortBuffer);
    (local_10->IO).MouseWheelH = 0.0;
    (local_10->IO).MouseWheel = 0.0;
    memset((local_10->IO).InputCharacters,0,0x22);
    memset((local_10->IO).NavInputs,0,0x54);
    local_10->FrameCountEnded = local_10->FrameCount;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);                       // Forgot to call ImGui::NewFrame()
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit "Debug" window if it hasn't been used
    IM_ASSERT(g.CurrentWindowStack.Size == 1);    // Mismatched Begin()/End() calls, did you forget to call end on g.CurrentWindow->Name?
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    if (g.ActiveId == 0 && g.HoveredId == 0)
    {
        if (!g.NavWindow || !g.NavWindow->Appearing) // Unless we just made a window/popup appear
        {
            // Click to focus window and start moving (after we're done with all our widgets)
            if (g.IO.MouseClicked[0])
            {
                if (g.HoveredRootWindow != NULL)
                {
                    // Set ActiveId even if the _NoMove flag is set, without it dragging away from a window with _NoMove would activate hover on other windows.
                    FocusWindow(g.HoveredWindow);
                    SetActiveID(g.HoveredWindow->MoveId, g.HoveredWindow);
                    g.NavDisableHighlight = true;
                    g.ActiveIdClickOffset = g.IO.MousePos - g.HoveredRootWindow->Pos;
                    if (!(g.HoveredWindow->Flags & ImGuiWindowFlags_NoMove) && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoMove))
                        g.MovingWindow = g.HoveredWindow;
                }
                else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
                {
                    // Clicking on void disable focus
                    FocusWindow(NULL);
                }
            }

            // With right mouse button we close popups without changing focus
            // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
            if (g.IO.MouseClicked[1])
            {
                // Find the top-most window between HoveredWindow and the front most Modal Window.
                // This is where we can trim the popup stack.
                ImGuiWindow* modal = GetFrontMostPopupModal();
                bool hovered_window_above_modal = false;
                if (modal == NULL)
                    hovered_window_above_modal = true;
                for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
                {
                    ImGuiWindow* window = g.Windows[i];
                    if (window == modal)
                        break;
                    if (window == g.HoveredWindow)
                        hovered_window_above_modal = true;
                }
                ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
            }
        }
    }

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortedBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    memset(g.IO.InputCharacters, 0, sizeof(g.IO.InputCharacters));
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    g.FrameCountEnded = g.FrameCount;
}